

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_bind_value(sqlite3_stmt *pStmt,int i,sqlite3_value *pValue)

{
  ushort uVar1;
  int iVar2;
  
  uVar1 = pValue->flags;
  switch("\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05\x04\x05\x03\x05\x01\x05\x01\x05\x02\x05\x02\x05\x01\x05\x01\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x04\x05\x03\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05\x02\x05"
         [uVar1 & 0x3f]) {
  case '\x01':
    iVar2 = sqlite3_bind_int64(pStmt,i,(pValue->u).i);
    return iVar2;
  case '\x02':
    break;
  case '\x03':
    iVar2 = bindText(pStmt,i,pValue->z,(long)pValue->n,(_func_void_void_ptr *)0xffffffffffffffff,
                     pValue->enc);
    return iVar2;
  case '\x04':
    if ((uVar1 >> 10 & 1) != 0) {
      iVar2 = sqlite3_bind_zeroblob(pStmt,i,(pValue->u).nZero);
      return iVar2;
    }
    iVar2 = sqlite3_bind_blob(pStmt,i,pValue->z,pValue->n,(_func_void_void_ptr *)0xffffffffffffffff)
    ;
    return iVar2;
  default:
    iVar2 = vdbeUnbind((Vdbe *)pStmt,i - 1);
    if ((iVar2 == 0) && (*(sqlite3_mutex **)(*(long *)pStmt + 0x18) != (sqlite3_mutex *)0x0)) {
      (*sqlite3Config.mutex.xMutexLeave)(*(sqlite3_mutex **)(*(long *)pStmt + 0x18));
    }
    return iVar2;
  }
  if ((uVar1 & 8) != 0) {
    iVar2 = sqlite3_bind_double(pStmt,i,(pValue->u).r);
    return iVar2;
  }
  iVar2 = sqlite3_bind_double(pStmt,i,(double)(pValue->u).i);
  return iVar2;
}

Assistant:

SQLITE_API int sqlite3_bind_value(sqlite3_stmt *pStmt, int i, const sqlite3_value *pValue){
  int rc;
  switch( sqlite3_value_type((sqlite3_value*)pValue) ){
    case SQLITE_INTEGER: {
      rc = sqlite3_bind_int64(pStmt, i, pValue->u.i);
      break;
    }
    case SQLITE_FLOAT: {
      assert( pValue->flags & (MEM_Real|MEM_IntReal) );
      rc = sqlite3_bind_double(pStmt, i,
          (pValue->flags & MEM_Real) ? pValue->u.r : (double)pValue->u.i
      );
      break;
    }
    case SQLITE_BLOB: {
      if( pValue->flags & MEM_Zero ){
        rc = sqlite3_bind_zeroblob(pStmt, i, pValue->u.nZero);
      }else{
        rc = sqlite3_bind_blob(pStmt, i, pValue->z, pValue->n,SQLITE_TRANSIENT);
      }
      break;
    }
    case SQLITE_TEXT: {
      rc = bindText(pStmt,i,  pValue->z, pValue->n, SQLITE_TRANSIENT,
                              pValue->enc);
      break;
    }
    default: {
      rc = sqlite3_bind_null(pStmt, i);
      break;
    }
  }
  return rc;
}